

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O3

ScalarFunctionSet * duckdb::ListRangeFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *this;
  BaseScalarFunction *pBVar1;
  ScalarFunctionSet *in_RDI;
  long lVar2;
  ScalarFunction *func;
  BaseScalarFunction *function;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  initializer_list<duckdb::LogicalType> __l_02;
  allocator_type local_789;
  LogicalType local_788 [24];
  ScalarFunctionSet *local_770;
  LogicalType local_768 [24];
  LogicalType local_750 [24];
  LogicalType local_738 [24];
  code *local_720;
  undefined8 local_718;
  code *local_710;
  code *local_708;
  code *local_700;
  undefined8 local_6f8;
  code *local_6f0;
  code *local_6e8;
  code *local_6e0;
  undefined8 local_6d8;
  code *local_6d0;
  code *local_6c8;
  code *local_6c0;
  undefined8 local_6b8;
  code *local_6b0;
  code *local_6a8;
  LogicalType local_6a0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_688;
  LogicalType local_670 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_658;
  LogicalType local_640 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_628;
  LogicalType local_610 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_5f8;
  LogicalType local_5e0 [24];
  LogicalType local_5c8 [24];
  LogicalType local_5b0 [24];
  LogicalType local_598 [24];
  ScalarFunction local_580;
  ScalarFunction local_458;
  ScalarFunction local_330;
  ScalarFunction local_208;
  BaseScalarFunction local_e0 [176];
  
  duckdb::ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  local_770 = in_RDI;
  duckdb::LogicalType::LogicalType(local_768,BIGINT);
  __l._M_len = 1;
  __l._M_array = local_768;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_5f8,__l,&local_789);
  duckdb::LogicalType::LogicalType(local_788,BIGINT);
  duckdb::LogicalType::LIST(local_610);
  local_6b8 = 0;
  local_6c0 = ListRangeFunction<duckdb::NumericRangeInfo,false>;
  local_6a8 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_6b0 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_598,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_208,&local_5f8,local_610,&local_6c0,0,0,0,0,local_598,0,0,0);
  this = (vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)(in_RDI + 0x20);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_208);
  local_208._0_8_ = &PTR__ScalarFunction_008914d8;
  if (local_208.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_208.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_208.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_208.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_208 + 0xb0U),(_Any_data *)((long)&local_208 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_208.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_598);
  if (local_6b0 != (code *)0x0) {
    (*local_6b0)(&local_6c0,&local_6c0,3);
  }
  duckdb::LogicalType::~LogicalType(local_610);
  duckdb::LogicalType::~LogicalType(local_788);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_5f8);
  duckdb::LogicalType::~LogicalType(local_768);
  duckdb::LogicalType::LogicalType(local_768,BIGINT);
  duckdb::LogicalType::LogicalType(local_750,BIGINT);
  __l_00._M_len = 2;
  __l_00._M_array = local_768;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_628,__l_00,&local_789);
  duckdb::LogicalType::LogicalType(local_788,BIGINT);
  duckdb::LogicalType::LIST(local_640);
  local_6d8 = 0;
  local_6e0 = ListRangeFunction<duckdb::NumericRangeInfo,false>;
  local_6c8 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_6d0 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_5b0,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_330,&local_628,local_640,&local_6e0,0,0,0,0,local_5b0,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_330);
  local_330._0_8_ = &PTR__ScalarFunction_008914d8;
  if (local_330.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_330.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_330.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_330.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_330 + 0xb0U),(_Any_data *)((long)&local_330 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_330.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_5b0);
  if (local_6d0 != (code *)0x0) {
    (*local_6d0)(&local_6e0,&local_6e0,3);
  }
  duckdb::LogicalType::~LogicalType(local_640);
  duckdb::LogicalType::~LogicalType(local_788);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_628);
  lVar2 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType(local_768 + lVar2);
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  duckdb::LogicalType::LogicalType(local_768,BIGINT);
  duckdb::LogicalType::LogicalType(local_750,BIGINT);
  duckdb::LogicalType::LogicalType(local_738,BIGINT);
  __l_01._M_len = 3;
  __l_01._M_array = local_768;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_658,__l_01,&local_789);
  duckdb::LogicalType::LogicalType(local_788,BIGINT);
  duckdb::LogicalType::LIST(local_670);
  local_6f8 = 0;
  local_700 = ListRangeFunction<duckdb::NumericRangeInfo,false>;
  local_6e8 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_6f0 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_5c8,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_458,&local_658,local_670,&local_700,0,0,0,0,local_5c8,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_458);
  local_458._0_8_ = &PTR__ScalarFunction_008914d8;
  if (local_458.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_458.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_458.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_458.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_458 + 0xb0U),(_Any_data *)((long)&local_458 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_458.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_5c8);
  if (local_6f0 != (code *)0x0) {
    (*local_6f0)(&local_700,&local_700,3);
  }
  duckdb::LogicalType::~LogicalType(local_670);
  duckdb::LogicalType::~LogicalType(local_788);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_658);
  lVar2 = 0x30;
  do {
    duckdb::LogicalType::~LogicalType(local_768 + lVar2);
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  duckdb::LogicalType::LogicalType(local_768,TIMESTAMP);
  duckdb::LogicalType::LogicalType(local_750,TIMESTAMP);
  duckdb::LogicalType::LogicalType(local_738,INTERVAL);
  __l_02._M_len = 3;
  __l_02._M_array = local_768;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_688,__l_02,&local_789);
  duckdb::LogicalType::LogicalType(local_788,TIMESTAMP);
  duckdb::LogicalType::LIST(local_6a0);
  local_718 = 0;
  local_720 = ListRangeFunction<duckdb::TimestampRangeInfo,false>;
  local_708 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_710 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_5e0,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_580,&local_688,local_6a0,&local_720,0,0,0,0,local_5e0,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_580);
  local_580._0_8_ = &PTR__ScalarFunction_008914d8;
  if (local_580.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_580.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_580.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_580.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_580 + 0xb0U),(_Any_data *)((long)&local_580 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_580.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_5e0);
  if (local_710 != (code *)0x0) {
    (*local_710)(&local_720,&local_720,3);
  }
  duckdb::LogicalType::~LogicalType(local_6a0);
  duckdb::LogicalType::~LogicalType(local_788);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_688);
  lVar2 = 0x30;
  do {
    duckdb::LogicalType::~LogicalType(local_768 + lVar2);
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  function = *(BaseScalarFunction **)(local_770 + 0x20);
  pBVar1 = *(BaseScalarFunction **)(local_770 + 0x28);
  if (function != pBVar1) {
    do {
      BaseScalarFunction::SetReturnsError(local_e0,function);
      duckdb::BaseScalarFunction::~BaseScalarFunction(local_e0);
      function = function + 0x128;
    } while (function != pBVar1);
  }
  return local_770;
}

Assistant:

ScalarFunctionSet ListRangeFun::GetFunctions() {
	// the arguments and return types are actually set in the binder function
	ScalarFunctionSet range_set;
	range_set.AddFunction(ScalarFunction({LogicalType::BIGINT}, LogicalType::LIST(LogicalType::BIGINT),
	                                     ListRangeFunction<NumericRangeInfo, false>));
	range_set.AddFunction(ScalarFunction({LogicalType::BIGINT, LogicalType::BIGINT},
	                                     LogicalType::LIST(LogicalType::BIGINT),
	                                     ListRangeFunction<NumericRangeInfo, false>));
	range_set.AddFunction(ScalarFunction({LogicalType::BIGINT, LogicalType::BIGINT, LogicalType::BIGINT},
	                                     LogicalType::LIST(LogicalType::BIGINT),
	                                     ListRangeFunction<NumericRangeInfo, false>));
	range_set.AddFunction(ScalarFunction({LogicalType::TIMESTAMP, LogicalType::TIMESTAMP, LogicalType::INTERVAL},
	                                     LogicalType::LIST(LogicalType::TIMESTAMP),
	                                     ListRangeFunction<TimestampRangeInfo, false>));
	for (auto &func : range_set.functions) {
		BaseScalarFunction::SetReturnsError(func);
	}
	return range_set;
}